

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  byte bVar2;
  uchar uVar3;
  byte *pbVar4;
  undefined3 uVar5;
  bool bVar6;
  byte abVar7 [4];
  bool bVar8;
  byte bVar9;
  int iVar10;
  uint x_00;
  uint uVar11;
  int iVar12;
  int iVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  uchar *puVar16;
  ulong uVar17;
  ulong uVar18;
  undefined7 uVar20;
  ulong uVar19;
  byte bVar21;
  int iVar22;
  uchar *puVar23;
  uint c;
  ulong unaff_R13;
  uint uVar24;
  long lVar25;
  ulong __n;
  bool bVar26;
  bool bVar27;
  uchar raw_data [4];
  uint local_88;
  uint local_84;
  byte local_7c [4];
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  stbi_uc *local_60;
  uchar *local_58;
  stbi_uc *local_50;
  uint local_48;
  uint local_44;
  ulong local_40;
  uint local_38;
  int local_34;
  
  psVar15 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  uVar5 = (undefined3)((uint)req_comp >> 8);
  local_70 = (uint *)y;
  local_50 = (stbi_uc *)x;
  if (psVar15 < psVar14) {
    s->img_buffer = psVar15 + 1;
    local_78 = (stbi_uc *)
               CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)psVar15 >> 8),*psVar15));
    psVar15 = psVar15 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_78 = (stbi_uc *)((ulong)local_78._4_4_ << 0x20);
  }
  else {
    psVar1 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_78 = (stbi_uc *)((ulong)local_78._4_4_ << 0x20);
    }
    else {
      psVar14 = psVar1 + iVar10;
      local_78 = (stbi_uc *)
                 CONCAT44(local_78._4_4_,(int)CONCAT71((int7)((ulong)psVar15 >> 8),*psVar1));
    }
    psVar15 = s->buffer_start + 1;
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar15;
  }
  if (psVar15 < psVar14) {
    s->img_buffer = psVar15 + 1;
    bVar21 = *psVar15;
    psVar15 = psVar15 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar21 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar21 = 0;
    }
    else {
      bVar21 = *psVar14;
      psVar14 = psVar14 + iVar10;
    }
    psVar15 = s->buffer_start + 1;
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar15;
  }
  if (psVar15 < psVar14) {
    s->img_buffer = psVar15 + 1;
    bVar2 = *psVar15;
  }
  else if (s->read_from_callbacks == 0) {
    bVar2 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar10 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar2 = 0;
    }
    else {
      bVar2 = *psVar14;
      psVar14 = psVar14 + iVar10;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar10 = stbi__get16le(s);
  local_44 = stbi__get16le(s);
  psVar14 = s->img_buffer;
  local_34 = req_comp;
  if (psVar14 < s->img_buffer_end) {
    s->img_buffer = psVar14 + 1;
    uVar18 = (ulong)CONCAT31(uVar5,*psVar14);
  }
  else if (s->read_from_callbacks == 0) {
    uVar18 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar18 = 0;
    }
    else {
      uVar18 = (ulong)CONCAT31(uVar5,*psVar14);
      psVar14 = psVar14 + iVar12;
    }
    s->img_buffer_end = psVar14;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar11 = stbi__get16le(s);
  psVar15 = s->img_buffer;
  psVar14 = s->img_buffer_end;
  if (psVar15 < psVar14) {
    s->img_buffer = psVar15 + 1;
    local_84 = (uint)CONCAT71((int7)((ulong)psVar15 >> 8),*psVar15);
    psVar15 = psVar15 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_84 = 0;
  }
  else {
    psVar1 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_84 = 0;
    }
    else {
      psVar14 = psVar1 + iVar12;
      local_84 = (uint)CONCAT71((int7)((ulong)psVar15 >> 8),*psVar1);
    }
    psVar15 = s->buffer_start + 1;
    s->img_buffer_end = psVar14;
    s->img_buffer = psVar15;
    unaff_R13 = uVar18;
  }
  if (psVar15 < psVar14) {
    s->img_buffer = psVar15 + 1;
    uVar17 = CONCAT71((int7)(unaff_R13 >> 8),*psVar15);
  }
  else if (s->read_from_callbacks == 0) {
    uVar17 = 0;
  }
  else {
    psVar14 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar14 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar24 = 0;
    }
    else {
      uVar24 = (uint)CONCAT71((int7)((ulong)psVar15 >> 8),*psVar14);
      psVar14 = psVar14 + iVar12;
    }
    s->img_buffer_end = psVar14;
    uVar17 = (ulong)uVar24;
    s->img_buffer = s->buffer_start + 1;
  }
  local_7c[0] = 0;
  local_7c[1] = 0;
  local_7c[2] = 0;
  local_7c[3] = 0;
  uVar20 = (undefined7)(uVar18 >> 8);
  if (bVar21 == 0) {
    uVar24 = local_84 & 0xff;
    if ((local_84 & 0xff) < 0x10) {
      if ((local_84 & 0xff) != 8) {
        if (uVar24 != 0xf) goto LAB_0016b491;
        goto LAB_0016b478;
      }
LAB_0016b48a:
      uVar24 = (uint)CONCAT71(uVar20,1);
    }
    else {
      if ((uVar24 == 0x20) || (uVar24 == 0x18)) {
        uVar18 = (ulong)local_84;
        goto LAB_0016b4a1;
      }
      if (uVar24 != 0x10) goto LAB_0016b491;
      uVar24 = bVar2 - 8;
      if (bVar2 < 8) {
        uVar24 = (uint)bVar2;
      }
      if (uVar24 != 3) goto LAB_0016b478;
      uVar24 = (uint)CONCAT71(uVar20,2);
    }
LAB_0016b4a7:
    bVar27 = true;
    bVar6 = false;
  }
  else {
    uVar24 = (uint)uVar18 & 0xff;
    if (0x17 < uVar24) {
      if ((uVar24 != 0x18) && (uVar24 != 0x20)) {
LAB_0016b491:
        stbi__g_failure_reason = "bad format";
        return (void *)0x0;
      }
LAB_0016b4a1:
      uVar24 = (uint)CONCAT71((int7)(uVar18 >> 8),(byte)uVar18 >> 3);
      goto LAB_0016b4a7;
    }
    if (1 < uVar24 - 0xf) {
      if (uVar24 != 8) goto LAB_0016b491;
      goto LAB_0016b48a;
    }
LAB_0016b478:
    uVar24 = (uint)CONCAT71(uVar20,3);
    bVar6 = true;
    bVar27 = false;
  }
  c = uVar24 & 0xff;
  *(uint *)local_50 = x_00;
  *local_70 = uVar11;
  if (comp != (int *)0x0) {
    *comp = c;
  }
  iVar12 = stbi__mad3sizes_valid(x_00,uVar11,c,0);
  if (iVar12 == 0) {
    stbi__g_failure_reason = "too large";
    return (void *)0x0;
  }
  local_68 = (ulong)uVar11;
  local_58 = (uchar *)stbi__malloc_mad3(x_00,uVar11,c,0);
  if (local_58 == (uchar *)0x0) {
LAB_0016b624:
    stbi__g_failure_reason = "outofmem";
    return (void *)0x0;
  }
  local_48 = (uint)CONCAT71((int7)(uVar17 >> 8),(byte)uVar17 >> 5);
  local_38 = uVar24;
  stbi__skip(s,(uint)(byte)local_78);
  uVar11 = local_48;
  puVar16 = local_58;
  local_70 = (uint *)(CONCAT44(local_70._4_4_,uVar24) & 0xffffffff000000ff);
  if ((bVar2 < 8 && bVar21 == 0) && !bVar6) {
    if ((int)local_68 != 0) {
      iVar22 = 0;
      iVar12 = x_00 * (int)local_70;
      iVar10 = (int)local_68;
      do {
        iVar10 = iVar10 + -1;
        iVar13 = iVar22;
        if ((uVar11 & 1) == 0) {
          iVar13 = iVar10;
        }
        stbi__getn(s,puVar16 + iVar13 * iVar12,iVar12);
        iVar22 = iVar22 + 1;
      } while (iVar10 != 0);
    }
  }
  else {
    if (bVar21 == 0) {
      local_60 = (stbi_uc *)0x0;
    }
    else {
      stbi__skip(s,iVar10);
      uVar11 = local_44;
      psVar14 = (stbi_uc *)stbi__malloc_mad2(local_44,c,0);
      if (psVar14 == (stbi_uc *)0x0) {
        free(local_58);
        goto LAB_0016b624;
      }
      local_60 = psVar14;
      if (bVar27) {
        iVar10 = stbi__getn(s,psVar14,uVar11 * c);
        if (iVar10 == 0) {
          free(local_58);
          free(psVar14);
          stbi__g_failure_reason = "bad palette";
          return (void *)0x0;
        }
      }
      else {
        if (c != 3) {
          __assert_fail("tga_comp == STBI_rgb",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                        ,0x15e6,
                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                       );
        }
        if (uVar11 != 0) {
          lVar25 = 0;
          do {
            uVar24 = stbi__get16le(s);
            psVar14[lVar25] = (stbi_uc)(((uVar24 >> 10 & 0x1f) * 0xff) / 0x1f);
            psVar14[lVar25 + 1] = (stbi_uc)(((uVar24 >> 5 & 0x1f) * 0xff) / 0x1f);
            psVar14[lVar25 + 2] = (stbi_uc)(((uVar24 & 0x1f) * 0xff) / 0x1f);
            lVar25 = lVar25 + 3;
          } while (uVar11 * 3 != (int)lVar25);
        }
      }
    }
    uVar11 = (int)local_68 * x_00;
    if (uVar11 != 0) {
      local_50 = s->buffer_start;
      local_78 = s->buffer_start + 1;
      uVar18 = (ulong)uVar11;
      bVar8 = true;
      uVar17 = 0;
      iVar10 = 0;
      __n = (ulong)local_70 & 0xffffffff;
      local_88 = 0;
      local_40 = uVar18;
      do {
        psVar14 = local_50;
        if (bVar2 < 8) {
LAB_0016b7f6:
          psVar14 = local_50;
          if (bVar21 == 0) {
            if (!bVar27) {
              if ((int)local_70 != 3) {
                __assert_fail("tga_comp == STBI_rgb",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                              ,0x1617,
                              "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                             );
              }
              uVar11 = stbi__get16le(s);
              abVar7 = local_7c;
              local_7c[1] = (char)(((uVar11 >> 5 & 0x1f) * 0xff) / 0x1f);
              local_7c[0] = (char)(((uVar11 >> 10 & 0x1f) * 0xff) / 0x1f);
              local_7c[3] = abVar7[3];
              local_7c[2] = (char)(((uVar11 & 0x1f) * 0xff) / 0x1f);
              goto LAB_0016b9f5;
            }
            if ((int)local_70 != 0) {
              psVar14 = s->img_buffer;
              psVar15 = s->img_buffer_end;
              uVar19 = 0;
              do {
                psVar1 = local_50;
                if (psVar14 < psVar15) {
                  s->img_buffer = psVar14 + 1;
                  bVar9 = *psVar14;
                  psVar14 = psVar14 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar9 = 0;
                }
                else {
                  iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_50,s->buflen);
                  if (iVar12 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar9 = 0;
                    psVar15 = local_78;
                  }
                  else {
                    bVar9 = *psVar1;
                    psVar15 = psVar1 + iVar12;
                  }
                  s->img_buffer_end = psVar15;
                  s->img_buffer = local_78;
                  psVar14 = local_78;
                }
                local_7c[uVar19] = bVar9;
                uVar19 = uVar19 + 1;
                uVar18 = local_40;
              } while (__n != uVar19);
              goto LAB_0016b8d7;
            }
          }
          else {
            if ((char)local_84 == '\b') {
              pbVar4 = s->img_buffer;
              if (pbVar4 < s->img_buffer_end) {
                s->img_buffer = pbVar4 + 1;
                bVar9 = *pbVar4;
              }
              else if (s->read_from_callbacks == 0) {
                bVar9 = 0;
              }
              else {
                iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_50,s->buflen);
                if (iVar12 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar9 = 0;
                  psVar14 = local_78;
                }
                else {
                  bVar9 = *psVar14;
                  psVar14 = psVar14 + iVar12;
                }
                s->img_buffer_end = psVar14;
                s->img_buffer = local_78;
                uVar18 = local_40;
              }
              uVar11 = (uint)bVar9;
            }
            else {
              uVar11 = stbi__get16le(s);
            }
            if ((int)local_70 != 0) {
              if (local_44 <= uVar11) {
                uVar11 = 0;
              }
              memcpy(local_7c,local_60 + uVar11 * (int)local_70,__n);
LAB_0016b9f5:
              memcpy(local_58 + (uint)((int)local_70 * (int)uVar17),local_7c,__n);
            }
          }
        }
        else {
          if (iVar10 == 0) {
            pbVar4 = s->img_buffer;
            if (pbVar4 < s->img_buffer_end) {
              s->img_buffer = pbVar4 + 1;
              bVar9 = *pbVar4;
            }
            else if (s->read_from_callbacks == 0) {
              bVar9 = 0;
            }
            else {
              iVar10 = (*(s->io).read)(s->io_user_data,(char *)local_50,s->buflen);
              if (iVar10 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar9 = 0;
                psVar14 = local_78;
              }
              else {
                bVar9 = *psVar14;
                psVar14 = psVar14 + iVar10;
              }
              s->img_buffer_end = psVar14;
              s->img_buffer = local_78;
            }
            iVar10 = (bVar9 & 0x7f) + 1;
            local_88 = (uint)(bVar9 >> 7);
            goto LAB_0016b7f6;
          }
          bVar26 = local_88 != 0;
          local_88 = 1;
          if (!bVar26 || bVar8) {
            local_88 = (uint)bVar26;
            goto LAB_0016b7f6;
          }
LAB_0016b8d7:
          if ((int)local_70 != 0) goto LAB_0016b9f5;
        }
        iVar10 = iVar10 + -1;
        uVar17 = uVar17 + 1;
        bVar8 = false;
      } while (uVar17 != uVar18);
    }
    puVar16 = local_58;
    if ((local_48 & 1) == 0 && (int)local_68 != 0) {
      iVar10 = x_00 * (int)local_70;
      uVar24 = 0;
      iVar12 = iVar10 * ((int)local_68 - 1U);
      uVar11 = 0;
      do {
        if (iVar10 != 0) {
          puVar23 = local_58;
          iVar22 = iVar10 + 1;
          do {
            uVar3 = puVar23[uVar24];
            iVar22 = iVar22 + -1;
            puVar23[uVar24] = puVar23[iVar12];
            puVar23[iVar12] = uVar3;
            puVar23 = puVar23 + 1;
          } while (1 < iVar22);
        }
        iVar12 = iVar12 - iVar10;
        uVar24 = uVar24 + iVar10;
        bVar27 = uVar11 != (int)local_68 - 1U >> 1;
        uVar11 = uVar11 + 1;
      } while (bVar27);
    }
    if (local_60 != (stbi_uc *)0x0) {
      free(local_60);
    }
  }
  if ((!bVar6 && 2 < (byte)local_38) && (iVar10 = (uint)local_68 * x_00, iVar10 != 0)) {
    puVar23 = puVar16 + 2;
    do {
      uVar3 = puVar23[-2];
      puVar23[-2] = *puVar23;
      *puVar23 = uVar3;
      puVar23 = puVar23 + ((ulong)local_70 & 0xffffffff);
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  if (local_34 != 0) {
    if ((int)local_70 != local_34) {
      puVar16 = stbi__convert_format(puVar16,(int)local_70,local_34,x_00,(uint)local_68);
      return puVar16;
    }
    return puVar16;
  }
  return puVar16;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}